

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

Vector3d *
RigidBodyDynamics::CalcPointVelocity
          (Vector3d *__return_storage_ptr__,Model *model,VectorNd *Q,VectorNd *QDot,uint body_id,
          Vector3d *point_position,bool update_kinematics)

{
  uint body_id_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPVar4;
  SpatialTransform *pSVar5;
  byte bVar6;
  Vector3d local_178;
  Matrix3d *local_160;
  SpatialVector point_spatial_velocity;
  Vector3d base_coords;
  Matrix3d local_c0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_78 [72];
  
  bVar6 = 0;
  uVar3 = (ulong)body_id;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start);
  if (update_kinematics) {
    UpdateKinematicsCustom(model,Q,QDot,(VectorNd *)0x0);
  }
  local_178.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[2];
  local_178.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[0];
  local_178.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] =
       (point_position->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[1];
  bVar1 = Model::IsFixedBodyId(model,body_id);
  if (bVar1) {
    body_id_00 = (model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [body_id - model->fixed_body_discriminator].mMovableParent;
    CalcBodyToBaseCoordinates(&base_coords,model,Q,body_id,point_position,false);
    CalcBaseToBodyCoordinates(&local_178,model,Q,body_id_00,&base_coords,false);
    uVar3 = (ulong)body_id_00;
  }
  CalcBodyWorldOrientation(&local_c0,model,Q,(uint)uVar3,false);
  local_160 = &local_c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            (local_78,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                      &local_160);
  pPVar4 = local_78;
  pSVar5 = (SpatialTransform *)&base_coords;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pSVar5->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = *(double *)pPVar4;
    pPVar4 = pPVar4 + (ulong)bVar6 * -0x10 + 8;
    pSVar5 = (SpatialTransform *)((long)pSVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  Math::SpatialTransform::apply
            ((SpatialTransform *)&base_coords,
             (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar3);
  (__return_storage_ptr__->super_Vector3d).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       point_spatial_velocity.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (__return_storage_ptr__->super_Vector3d).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       point_spatial_velocity.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (__return_storage_ptr__->super_Vector3d).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       point_spatial_velocity.super_Matrix<double,_6,_1,_0,_6,_1>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI Vector3d CalcPointVelocity (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    unsigned int body_id,
    const Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (model.IsBodyId(body_id) || body_id == 0);
  assert (model.q_size == Q.size());
  assert (model.qdot_size == QDot.size());

  // Reset the velocity of the root body
  model.v[0].setZero();

  // update the Kinematics with zero acceleration
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates(model, Q, body_id, point_position, false);
    reference_point =
      CalcBaseToBodyCoordinates(model, Q, reference_body_id, base_coords,false);
  }

  SpatialVector point_spatial_velocity = 
    SpatialTransform (
        CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(), 
        reference_point).apply(model.v[reference_body_id]);

  return Vector3d (
      point_spatial_velocity[3],
      point_spatial_velocity[4],
      point_spatial_velocity[5]
      );
}